

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLBigDecimal::XMLBigDecimal
          (XMLBigDecimal *this,XMLCh *strValue,MemoryManager *manager)

{
  int iVar1;
  NumberFormatException *this_00;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  OutOfMemoryException *anon_var_0;
  undefined1 local_48 [8];
  CleanupType_conflict3 cleanup;
  MemoryManager *manager_local;
  XMLCh *strValue_local;
  XMLBigDecimal *this_local;
  
  XMLNumber::XMLNumber(&this->super_XMLNumber);
  (this->super_XMLNumber).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__XMLBigDecimal_00526790;
  this->fSign = 0;
  this->fTotalDigits = 0;
  this->fScale = 0;
  this->fRawDataLen = 0;
  this->fRawData = (XMLCh *)0x0;
  this->fIntVal = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  if ((strValue != (XMLCh *)0x0) && (*strValue != L'\0')) {
    JanitorMemFunCall<xercesc_4_0::XMLBigDecimal>::JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::XMLBigDecimal> *)local_48,this,(MFPT)cleanUp);
    XVar2 = XMLString::stringLen(strValue);
    this->fRawDataLen = XVar2;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,this->fRawDataLen * 4 + 4);
    this->fRawData = (XMLCh *)CONCAT44(extraout_var,iVar1);
    memcpy(this->fRawData,strValue,this->fRawDataLen * 2);
    this->fRawData[this->fRawDataLen] = L'\0';
    this->fIntVal = this->fRawData + this->fRawDataLen + 1;
    parseDecimal(strValue,this->fIntVal,&this->fSign,(int *)&this->fTotalDigits,(int *)&this->fScale
                 ,this->fMemoryManager);
    JanitorMemFunCall<xercesc_4_0::XMLBigDecimal>::release
              ((JanitorMemFunCall<xercesc_4_0::XMLBigDecimal> *)local_48);
    JanitorMemFunCall<xercesc_4_0::XMLBigDecimal>::~JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::XMLBigDecimal> *)local_48);
    return;
  }
  this_00 = (NumberFormatException *)__cxa_allocate_exception(0x30);
  NumberFormatException::NumberFormatException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
             ,0x40,XMLNUM_emptyString,this->fMemoryManager);
  __cxa_throw(this_00,&NumberFormatException::typeinfo,NumberFormatException::~NumberFormatException
             );
}

Assistant:

XMLBigDecimal::XMLBigDecimal(const XMLCh* const strValue,
                             MemoryManager* const manager)
: fSign(0)
, fTotalDigits(0)
, fScale(0)
, fRawDataLen(0)
, fRawData(0)
, fIntVal(0)
, fMemoryManager(manager)
{
    if ((!strValue) || (!*strValue))
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, fMemoryManager);

    CleanupType cleanup(this, &XMLBigDecimal::cleanUp);

    try
    {
        fRawDataLen = XMLString::stringLen(strValue);
        fRawData = (XMLCh*) fMemoryManager->allocate
        (
            ((fRawDataLen*2) + 2) * sizeof(XMLCh) //fRawData and fIntVal
        );
        memcpy(fRawData, strValue, fRawDataLen * sizeof(XMLCh));
        fRawData[fRawDataLen] = chNull;
        fIntVal = fRawData + fRawDataLen + 1;
        parseDecimal(strValue, fIntVal, fSign, (int&) fTotalDigits, (int&) fScale, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}